

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_1730dca::cURLProgressHelper::UpdatePercentage
          (cURLProgressHelper *this,cm_curl_off_t value,cm_curl_off_t total,string *status)

{
  long lVar1;
  long lVar2;
  long lVar3;
  cmAlphaNum *pcVar4;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string local_100;
  undefined1 local_e0 [56];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_a8;
  size_type local_90;
  pointer local_88;
  undefined8 local_80;
  undefined8 local_78;
  char *local_70;
  undefined8 local_68;
  size_t local_60;
  string *local_58;
  cmAlphaNum *local_50;
  undefined8 local_48;
  char *local_40;
  undefined8 local_38;
  
  lVar1 = this->CurrentPercentage;
  if (0 < total) {
    lVar2 = lround(((double)value / (double)total) * 100.0);
    lVar3 = 100;
    if (lVar2 < 100) {
      lVar3 = lVar2;
    }
    this->CurrentPercentage = lVar3;
  }
  lVar3 = this->CurrentPercentage;
  if (lVar1 != lVar3) {
    local_a8.first._M_len = 1;
    local_a8.first._M_str = "[";
    local_a8.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_88 = (this->Text)._M_dataplus._M_p;
    local_90 = (this->Text)._M_string_length;
    local_80 = 0;
    local_78 = 1;
    local_70 = " ";
    local_68 = 0;
    cmAlphaNum::cmAlphaNum((cmAlphaNum *)local_e0,lVar3);
    pcVar4 = (cmAlphaNum *)(local_e0 + 0x10);
    if ((cmAlphaNum *)local_e0._0_8_ != (cmAlphaNum *)0x0) {
      pcVar4 = (cmAlphaNum *)local_e0._0_8_;
    }
    local_58 = pcVar4->RValueString_;
    pcVar4 = (cmAlphaNum *)local_e0;
    if ((cmAlphaNum *)local_e0._0_8_ != (cmAlphaNum *)0x0) {
      pcVar4 = (cmAlphaNum *)local_e0._0_8_;
    }
    local_60 = (pcVar4->View_)._M_len;
    local_50 = (cmAlphaNum *)local_e0._0_8_;
    local_48 = 0xb;
    local_40 = "% complete]";
    local_38 = 0;
    views._M_len = 5;
    views._M_array = &local_a8;
    cmCatViews(&local_100,views);
    std::__cxx11::string::operator=((string *)status,(string *)&local_100);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
  }
  return lVar1 != lVar3;
}

Assistant:

bool UpdatePercentage(cm_curl_off_t value, cm_curl_off_t total,
                        std::string& status)
  {
    long OldPercentage = this->CurrentPercentage;

    if (total > 0) {
      this->CurrentPercentage = std::lround(
        static_cast<double>(value) / static_cast<double>(total) * 100.0);
      if (this->CurrentPercentage > 100) {
        // Avoid extra progress reports for unexpected data beyond total.
        this->CurrentPercentage = 100;
      }
    }

    bool updated = (OldPercentage != this->CurrentPercentage);

    if (updated) {
      status =
        cmStrCat("[", this->Text, " ", this->CurrentPercentage, "% complete]");
    }

    return updated;
  }